

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

void __thiscall slack::_detail::CategoryChat::CategoryChat(CategoryChat *this,Slacking *slack)

{
  (this->channel)._M_dataplus._M_p = (pointer)&(this->channel).field_2;
  (this->channel)._M_string_length = 0;
  (this->channel).field_2._M_local_buf[0] = '\0';
  (this->username)._M_dataplus._M_p = (pointer)&(this->username).field_2;
  (this->username)._M_string_length = 0;
  (this->username).field_2._M_local_buf[0] = '\0';
  (this->icon_url)._M_dataplus._M_p = (pointer)&(this->icon_url).field_2;
  (this->icon_url)._M_string_length = 0;
  (this->icon_url).field_2._M_local_buf[0] = '\0';
  (this->icon_emoji)._M_dataplus._M_p = (pointer)&(this->icon_emoji).field_2;
  (this->icon_emoji)._M_string_length = 0;
  (this->icon_emoji).field_2._M_local_buf[0] = '\0';
  (this->parse)._M_dataplus._M_p = (pointer)&(this->parse).field_2;
  (this->parse)._M_string_length = 0;
  (this->parse).field_2._M_local_buf[0] = '\0';
  this->as_user = false;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->attachments,(nullptr_t)0x0);
  this->slack_ = slack;
  return;
}

Assistant:

CategoryChat(Slacking& slack) : slack_{slack} {}